

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

pair<QMultiHash<int,_QString>::iterator,_QMultiHash<int,_QString>::iterator> * __thiscall
QMultiHash<int,_QString>::equal_range_impl<int>
          (pair<QMultiHash<int,_QString>::iterator,_QMultiHash<int,_QString>::iterator>
           *__return_storage_ptr__,QMultiHash<int,_QString> *this,int *key)

{
  uchar *puVar1;
  uchar *puVar2;
  long in_FS_OFFSET;
  pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator> local_68;
  QMultiHash<int,_QString> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = this->d;
  if (local_38.d == (Data *)0x0) {
    local_38.d = (Data *)0x0;
    local_38.m_size = this->m_size;
  }
  else if ((uint)((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
    local_38.d = (Data *)0x0;
    local_38.m_size = 0;
  }
  else {
    local_38.m_size = this->m_size;
    if (((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  detach(this);
  local_68.second.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_68.second.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.second.i.d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.i.d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  equal_range_impl<int>(&local_68,this,key);
  if (local_68.first.i.d == (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
    puVar1 = (uchar *)0x0;
  }
  else {
    puVar1 = (local_68.first.i.d)->spans[local_68.first.i.bucket >> 7].entries
             [(local_68.first.i.d)->spans[local_68.first.i.bucket >> 7].offsets
              [(uint)local_68.first.i.bucket & 0x7f]].storage.data + 8;
  }
  if (local_68.second.i.d == (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
    puVar2 = (uchar *)0x0;
  }
  else {
    puVar2 = (local_68.second.i.d)->spans[local_68.second.i.bucket >> 7].entries
             [(local_68.second.i.d)->spans[local_68.second.i.bucket >> 7].offsets
              [(uint)local_68.second.i.bucket & 0x7f]].storage.data + 8;
  }
  (__return_storage_ptr__->first).i.d = local_68.first.i.d;
  (__return_storage_ptr__->first).i.bucket = local_68.first.i.bucket;
  (__return_storage_ptr__->first).e = (Chain **)puVar1;
  (__return_storage_ptr__->second).i.d = local_68.second.i.d;
  (__return_storage_ptr__->second).i.bucket = local_68.second.i.bucket;
  (__return_storage_ptr__->second).e = (Chain **)puVar2;
  ~QMultiHash(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<iterator, iterator> equal_range_impl(const K &key)
    {
        const auto copy = isDetached() ? QMultiHash() : *this; // keep 'key' alive across the detach
        detach();
        auto pair = std::as_const(*this).equal_range(key);
        return {iterator(pair.first.i), iterator(pair.second.i)};
    }